

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::OutputMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,Converter *a_oConverter,char *a_pText)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  
  cVar5 = *a_pText;
  while (pcVar3 = a_pText, cVar5 != '\0') {
    do {
      pcVar2 = pcVar3;
      cVar1 = *pcVar2;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar2 + 1;
    } while (cVar1 != '\n');
    *pcVar2 = '\0';
    bVar4 = Converter::ConvertToStore(a_oConverter,a_pText);
    if (!bVar4) break;
    *pcVar2 = cVar1;
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,(a_oConverter->m_scratch)._M_dataplus._M_p);
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    a_pText = pcVar2 + 1;
    cVar5 = cVar1;
  }
  return cVar5 == '\0';
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::OutputMultiLineText(
    OutputWriter &  a_oOutput,
    Converter &     a_oConverter,
    const SI_CHAR * a_pText
    ) const
{
    const SI_CHAR * pEndOfLine;
    SI_CHAR cEndOfLineChar = *a_pText;
    while (cEndOfLineChar) {
        // find the end of this line
        pEndOfLine = a_pText;
        for (; *pEndOfLine && *pEndOfLine != '\n'; ++pEndOfLine) /*loop*/ ;
        cEndOfLineChar = *pEndOfLine;

        // temporarily null terminate, convert and output the line
        *const_cast<SI_CHAR*>(pEndOfLine) = 0;
        if (!a_oConverter.ConvertToStore(a_pText)) {
            return false;
        }
        *const_cast<SI_CHAR*>(pEndOfLine) = cEndOfLineChar;
        a_pText += (pEndOfLine - a_pText) + 1;
        a_oOutput.Write(a_oConverter.Data());
        a_oOutput.Write(SI_NEWLINE_A);
    }
    return true;
}